

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

void __thiscall CEDate::SetDate(CEDate *this,double *date,CEDateType *time_format)

{
  undefined8 uVar1;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  double dVar2;
  double in_stack_00000008;
  double in_stack_ffffffffffffff20;
  allocator *paVar3;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  allocator local_b9;
  string local_b8 [24];
  double in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  invalid_value *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffffa8;
  
  if (*in_RDX == 0) {
    *(undefined8 *)(in_RDI + 8) = *in_RSI;
    dVar2 = JD2MJD(in_stack_ffffffffffffff20);
    *(double *)(in_RDI + 0x10) = dVar2;
    dVar2 = JD2Gregorian(in_stack_ffffffffffffff60);
    *(double *)(in_RDI + 0x18) = dVar2;
    JD2GregorianVect(in_stack_00000008);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  else if (*in_RDX == 1) {
    dVar2 = MJD2JD(in_stack_ffffffffffffff20);
    *(double *)(in_RDI + 8) = dVar2;
    *(undefined8 *)(in_RDI + 0x10) = *in_RSI;
    dVar2 = MJD2Gregorian(in_stack_ffffffffffffff20);
    *(double *)(in_RDI + 0x18) = dVar2;
    MJD2GregorianVect((double)in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  else {
    if (*in_RDX != 2) {
      uVar1 = __cxa_allocate_exception(0xa8);
      paVar3 = (allocator *)&stack0xffffffffffffff7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff80,"CEDate::SetDate()",paVar3);
      paVar3 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Invalid date type",paVar3);
      CEException::invalid_value::invalid_value
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    dVar2 = Gregorian2JD(in_stack_ffffffffffffff60);
    *(double *)(in_RDI + 8) = dVar2;
    dVar2 = Gregorian2MJD(in_stack_ffffffffffffff20);
    *(double *)(in_RDI + 0x10) = dVar2;
    *(undefined8 *)(in_RDI + 0x18) = *in_RSI;
    Gregorian2GregorianVect(in_stack_ffffffffffffffa8);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void CEDate::SetDate(const double&     date, 
                     const CEDateType& time_format)
{
    // Fill the internal date storage objects based on the format of the input "date"
    if (time_format == CEDateType::JD) {
        // Save information based on julian date input
        julian_date_ = date ;
        mod_julian_date_ = JD2MJD(date) ;
        gregorian_date_ = JD2Gregorian(date) ;
        gregorian_date_vect_ = JD2GregorianVect(date) ;
    } else if (time_format == CEDateType::MJD) {
        // Save information based on modified julian date input
        julian_date_ = MJD2JD(date) ;
        mod_julian_date_ = date ;
        gregorian_date_ = MJD2Gregorian(date) ;
        gregorian_date_vect_ = MJD2GregorianVect(date) ;
    } else if (time_format == CEDateType::GREGORIAN) {
        // Save information based on gregorian date input
        julian_date_ = Gregorian2JD(date) ;
        mod_julian_date_ = Gregorian2MJD(date) ;
        gregorian_date_ = date ;
        gregorian_date_vect_ = Gregorian2GregorianVect(date) ;
    } else {
        // Date type is invalid
        throw CEException::invalid_value("CEDate::SetDate()", 
                                         "Invalid date type");
    }
}